

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QXdgDesktopPortalFileDialog::FilterCondition>::erase
          (QGenericArrayOps<QXdgDesktopPortalFileDialog::FilterCondition> *this,FilterCondition *b,
          qsizetype n)

{
  FilterCondition *pFVar1;
  long lVar2;
  FilterCondition *__last;
  FilterCondition *pFVar3;
  
  __last = b + n;
  pFVar1 = (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).ptr;
  lVar2 = (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).size;
  pFVar3 = pFVar1 + lVar2;
  if (__last == pFVar3 || pFVar1 != b) {
    for (; __last = b + n, __last != pFVar3; b = b + 1) {
      QXdgDesktopPortalFileDialog::FilterCondition::operator=(b,__last);
    }
    lVar2 = (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).size;
  }
  else {
    (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).ptr = __last;
  }
  (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).size = lVar2 - n;
  std::_Destroy_aux<false>::__destroy<QXdgDesktopPortalFileDialog::FilterCondition*>(b,__last);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }